

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst.c
# Opt level: O0

boolean empty_mem_output_buffer(j_compress_ptr cinfo)

{
  long *plVar1;
  long lVar2;
  void *__dest;
  long *in_RDI;
  my_mem_dest_ptr dest;
  JOCTET *nextbuffer;
  size_t nextsize;
  
  plVar1 = (long *)in_RDI[5];
  lVar2 = plVar1[9];
  __dest = malloc(lVar2 << 1);
  if (__dest == (void *)0x0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x38;
    *(undefined4 *)(*in_RDI + 0x2c) = 10;
    (**(code **)*in_RDI)(in_RDI);
  }
  memcpy(__dest,(void *)plVar1[8],plVar1[9]);
  if (plVar1[7] != 0) {
    free((void *)plVar1[7]);
  }
  plVar1[7] = (long)__dest;
  *plVar1 = (long)__dest + plVar1[9];
  plVar1[1] = plVar1[9];
  plVar1[8] = (long)__dest;
  plVar1[9] = lVar2 << 1;
  return 1;
}

Assistant:

METHODDEF(boolean)
empty_mem_output_buffer (j_compress_ptr cinfo)
{
  size_t nextsize;
  JOCTET * nextbuffer;
  my_mem_dest_ptr dest = (my_mem_dest_ptr) cinfo->dest;

  /* Try to allocate new buffer with double size */
  nextsize = dest->bufsize * 2;
  nextbuffer = (JOCTET *) malloc(nextsize);

  if (nextbuffer == NULL)
    ERREXIT1(cinfo, JERR_OUT_OF_MEMORY, 10);

  MEMCOPY(nextbuffer, dest->buffer, dest->bufsize);

  if (dest->newbuffer != NULL)
    free(dest->newbuffer);

  dest->newbuffer = nextbuffer;

  dest->pub.next_output_byte = nextbuffer + dest->bufsize;
  dest->pub.free_in_buffer = dest->bufsize;

  dest->buffer = nextbuffer;
  dest->bufsize = nextsize;

  return TRUE;
}